

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::gt(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  BasicType BVar1;
  bool bVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  
  BVar1 = wasm::Type::getBasic(&this->type);
  if (BVar1 == f64) {
    dVar6 = getf64(this);
    dVar7 = getf64(other);
    bVar3 = dVar6 == dVar7;
    bVar2 = dVar6 < dVar7;
  }
  else {
    if (BVar1 != f32) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x5a0);
    }
    fVar4 = getf32(this);
    fVar5 = getf32(other);
    bVar3 = fVar4 == fVar5;
    bVar2 = fVar4 < fVar5;
  }
  *(uint *)&__return_storage_ptr__->field_0 = (uint)(!bVar2 && !bVar3);
  (__return_storage_ptr__->type).id = 2;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::gt(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::f32:
      return Literal(getf32() > other.getf32());
    case Type::f64:
      return Literal(getf64() > other.getf64());
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}